

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_memory.cpp
# Opt level: O1

void duckdb::DuckDBMemoryFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  idx_t index;
  reference pvVar1;
  char *pcVar2;
  _func_int **__n;
  idx_t iVar3;
  allocator local_a9;
  idx_t local_a8;
  GlobalTableFunctionState *local_a0;
  vector<duckdb::MemoryInformation,_true> *local_98;
  string local_90;
  Value local_70;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  local_a0 = (data_p->global_state).ptr;
  if (local_a0[4]._vptr_GlobalTableFunctionState <
      (_func_int **)
      (((long)local_a0[2]._vptr_GlobalTableFunctionState -
        (long)local_a0[1]._vptr_GlobalTableFunctionState >> 3) * -0x5555555555555555)) {
    __n = local_a0[4]._vptr_GlobalTableFunctionState;
    if (__n < (_func_int **)
              (((long)local_a0[2]._vptr_GlobalTableFunctionState -
                (long)local_a0[1]._vptr_GlobalTableFunctionState >> 3) * -0x5555555555555555)) {
      local_98 = (vector<duckdb::MemoryInformation,_true> *)(local_a0 + 1);
      local_a8 = 0;
      do {
        local_a0[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
        pvVar1 = vector<duckdb::MemoryInformation,_true>::operator[](local_98,(size_type)__n);
        pcVar2 = EnumUtil::ToChars<duckdb::MemoryTag>(pvVar1->tag);
        ::std::__cxx11::string::string((string *)&local_90,pcVar2,&local_a9);
        Value::Value(&local_70,&local_90);
        DataChunk::SetValue(output,0,local_a8,&local_70);
        Value::~Value(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        iVar3 = pvVar1->size;
        if ((long)iVar3 < 1) {
          iVar3 = 0;
        }
        Value::BIGINT(&local_70,iVar3);
        index = local_a8;
        DataChunk::SetValue(output,1,local_a8,&local_70);
        Value::~Value(&local_70);
        iVar3 = pvVar1->evicted_data;
        if ((long)iVar3 < 1) {
          iVar3 = 0;
        }
        Value::BIGINT(&local_70,iVar3);
        DataChunk::SetValue(output,2,index,&local_70);
        Value::~Value(&local_70);
        local_a8 = index + 1;
        __n = local_a0[4]._vptr_GlobalTableFunctionState;
      } while ((__n < (_func_int **)
                      (((long)local_a0[2]._vptr_GlobalTableFunctionState -
                        (long)local_a0[1]._vptr_GlobalTableFunctionState >> 3) * -0x5555555555555555
                      )) && (index < 0x7ff));
    }
    else {
      local_a8 = 0;
    }
    output->count = local_a8;
  }
  return;
}

Assistant:

void DuckDBMemoryFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBMemoryData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];
		// return values:
		idx_t col = 0;
		// tag, VARCHAR
		output.SetValue(col++, count, EnumUtil::ToString(entry.tag));
		// memory_usage_bytes, BIGINT
		output.SetValue(col++, count, Value::BIGINT(ClampReportedMemory(entry.size)));
		// temporary_storage_bytes, BIGINT
		output.SetValue(col++, count, Value::BIGINT(ClampReportedMemory(entry.evicted_data)));
		count++;
	}
	output.SetCardinality(count);
}